

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O2

MethodDefSig * __thiscall
winmd::reader::MemberRef::MethodSignature(MethodDefSig *__return_storage_ptr__,MemberRef *this)

{
  byte_view cursor;
  
  row_base<winmd::reader::MemberRef>::get_blob
            ((row_base<winmd::reader::MemberRef> *)&cursor,(uint32_t)this);
  MethodDefSig::MethodDefSig
            (__return_storage_ptr__,(this->super_row_base<winmd::reader::MemberRef>).m_table,&cursor
            );
  return __return_storage_ptr__;
}

Assistant:

MethodDefSig MethodSignature() const
        {
            auto cursor = get_blob(2);
            return{ get_table(), cursor };
        }